

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionCommand.cxx
# Opt level: O0

bool __thiscall
cmFunctionFunctionBlocker::IsFunctionBlocked
          (cmFunctionFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *param_3)

{
  int iVar1;
  char *pcVar2;
  cmFunctionHelperCommand *this_00;
  cmListFileContext *pcVar3;
  cmState *this_01;
  reference name;
  cmFunctionHelperCommand *local_38;
  cmFunctionHelperCommand *f;
  cmExecutionStatus *param_3_local;
  cmMakefile *mf_local;
  cmListFileFunction *lff_local;
  cmFunctionFunctionBlocker *this_local;
  
  f = (cmFunctionHelperCommand *)param_3;
  param_3_local = (cmExecutionStatus *)mf;
  mf_local = (cmMakefile *)lff;
  lff_local = (cmListFileFunction *)this;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = cmsys::SystemTools::Strucmp(pcVar2,"function");
  if (iVar1 == 0) {
    this->Depth = this->Depth + 1;
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = cmsys::SystemTools::Strucmp(pcVar2,"endfunction");
    if (iVar1 == 0) {
      if (this->Depth == 0) {
        this_00 = (cmFunctionHelperCommand *)operator_new(0xa0);
        cmFunctionHelperCommand::cmFunctionHelperCommand(this_00);
        local_38 = this_00;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&this_00->Args,&this->Args);
        std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator=
                  (&local_38->Functions,&this->Functions);
        pcVar3 = cmFunctionBlocker::GetStartingContext(&this->super_cmFunctionBlocker);
        std::__cxx11::string::operator=((string *)&local_38->FilePath,(string *)&pcVar3->FilePath);
        cmMakefile::RecordPolicies((cmMakefile *)param_3_local,&local_38->Policies);
        this_01 = cmMakefile::GetState((cmMakefile *)param_3_local);
        name = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->Args,0);
        cmState::AddScriptedCommand(this_01,name,&local_38->super_cmCommand);
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)&stack0xffffffffffffffb0,(cmFunctionBlocker *)param_3_local,
                   (cmListFileFunction *)this);
        ::cm::auto_ptr<cmFunctionBlocker>::~auto_ptr
                  ((auto_ptr<cmFunctionBlocker> *)&stack0xffffffffffffffb0);
        return true;
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,(value_type *)mf_local);
  return true;
}

Assistant:

bool cmFunctionFunctionBlocker::IsFunctionBlocked(
  const cmListFileFunction& lff, cmMakefile& mf, cmExecutionStatus&)
{
  // record commands until we hit the ENDFUNCTION
  // at the ENDFUNCTION call we shift gears and start looking for invocations
  if (!cmSystemTools::Strucmp(lff.Name.c_str(), "function")) {
    this->Depth++;
  } else if (!cmSystemTools::Strucmp(lff.Name.c_str(), "endfunction")) {
    // if this is the endfunction for this function then execute
    if (!this->Depth) {
      // create a new command and add it to cmake
      cmFunctionHelperCommand* f = new cmFunctionHelperCommand();
      f->Args = this->Args;
      f->Functions = this->Functions;
      f->FilePath = this->GetStartingContext().FilePath;
      mf.RecordPolicies(f->Policies);
      mf.GetState()->AddScriptedCommand(this->Args[0], f);
      // remove the function blocker now that the function is defined
      mf.RemoveFunctionBlocker(this, lff);
      return true;
    }
    // decrement for each nested function that ends
    this->Depth--;
  }

  // if it wasn't an endfunction and we are not executing then we must be
  // recording
  this->Functions.push_back(lff);
  return true;
}